

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

int __thiscall iDynTree::Visualizer::width(Visualizer *this)

{
  return 0;
}

Assistant:

int Visualizer::width() const
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","width","Visualizer not initialized.");
        return 0;
    }
#ifdef IDYNTREE_USE_GLFW_WINDOW
    GLint ww, wh;
    glfwGetWindowSize(pimpl->m_window, &ww, &wh);

    return ww;
#else
    auto winDimensions = pimpl->m_irrDriver->getScreenSize();
    return winDimensions.Width;
#endif
#else
    return 0;
#endif
}